

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

Iterator *
testing::internal::
CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<solitaire::colliders::UncoveredPileCardsPositionData>::Iterator_const,testing::internal::ParamIteratorInterface<solitaire::colliders::UncoveredPileCardsPositionData>const>
          (ParamIteratorInterface<solitaire::colliders::UncoveredPileCardsPositionData> *base)

{
  bool bVar1;
  ostream *poVar2;
  Iterator *local_48;
  GTestLog local_14;
  ParamIteratorInterface<solitaire::colliders::UncoveredPileCardsPositionData> *local_10;
  ParamIteratorInterface<solitaire::colliders::UncoveredPileCardsPositionData> *base_local;
  
  local_10 = base;
  if (base == (ParamIteratorInterface<solitaire::colliders::UncoveredPileCardsPositionData> *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)base->_vptr_ParamIteratorInterface[-1],
                     (type_info *)
                     &ValuesInIteratorRangeGenerator<solitaire::colliders::UncoveredPileCardsPositionData>
                      ::Iterator::typeinfo);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x45a);
    poVar2 = GTestLog::GetStream(&local_14);
    std::operator<<(poVar2,"Condition typeid(*base) == typeid(Derived) failed. ");
    GTestLog::~GTestLog(&local_14);
  }
  if (local_10 ==
      (ParamIteratorInterface<solitaire::colliders::UncoveredPileCardsPositionData> *)0x0) {
    local_48 = (Iterator *)0x0;
  }
  else {
    local_48 = (Iterator *)
               __dynamic_cast(local_10,&ParamIteratorInterface<solitaire::colliders::UncoveredPileCardsPositionData>
                                        ::typeinfo,
                              &ValuesInIteratorRangeGenerator<solitaire::colliders::UncoveredPileCardsPositionData>
                               ::Iterator::typeinfo,0);
  }
  return local_48;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}